

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  byte in_CL;
  long lVar4;
  uint in_EDX;
  double *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int i;
  u64 s2;
  int eType;
  int nDigit;
  int eValid;
  int e;
  int esign;
  int d;
  u64 s;
  int sign;
  char *zEnd;
  int incr;
  double rr [2];
  double local_b0;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 uVar10;
  undefined1 uVar11;
  double local_98;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  int in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  uint local_7c;
  int local_70;
  int local_6c;
  int iVar12;
  int iVar13;
  int local_60;
  int local_5c;
  ulong local_58;
  int local_4c;
  byte *local_48;
  int local_3c;
  byte *local_28;
  int local_1c;
  double local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = 1;
  local_58 = 0;
  local_5c = 0;
  local_60 = 1;
  iVar13 = 0;
  iVar12 = 1;
  local_6c = 0;
  local_70 = 1;
  *in_RSI = 0.0;
  if (in_EDX == 0) {
    local_1c = 0;
    goto LAB_00174308;
  }
  if (in_CL == 1) {
    local_3c = 1;
    lVar4 = (long)(int)in_EDX;
    local_28 = in_RDI;
  }
  else {
    local_3c = 2;
    local_7c = 3 - in_CL;
    while( true ) {
      bVar5 = false;
      if ((int)local_7c < (int)(in_EDX & 0xfffffffe)) {
        bVar5 = in_RDI[(int)local_7c] == 0;
      }
      if (!bVar5) break;
      local_7c = local_7c + 2;
    }
    if ((int)local_7c < (int)(in_EDX & 0xfffffffe)) {
      local_70 = -100;
    }
    lVar4 = (long)(int)(local_7c ^ 1);
    local_28 = in_RDI + (int)(in_CL & 1);
  }
  local_48 = in_RDI + lVar4;
  while( true ) {
    bVar5 = false;
    if (local_28 < local_48) {
      bVar5 = (""[*local_28] & 1) != 0;
    }
    if (!bVar5) break;
    local_28 = local_28 + local_3c;
  }
  if (local_48 <= local_28) {
    local_1c = 0;
    goto LAB_00174308;
  }
  if (*local_28 == 0x2d) {
    local_4c = -1;
    local_28 = local_28 + local_3c;
  }
  else if (*local_28 == 0x2b) {
    local_28 = local_28 + local_3c;
  }
  while( true ) {
    bVar5 = false;
    if (local_28 < local_48) {
      bVar5 = (""[*local_28] & 4) != 0;
    }
    if (!bVar5) break;
    local_58 = local_58 * 10 + (long)((char)*local_28 + -0x30);
    local_28 = local_28 + local_3c;
    local_6c = local_6c + 1;
    if (0x1999999999999997 < local_58) {
      while( true ) {
        bVar5 = false;
        if (local_28 < local_48) {
          bVar5 = (""[*local_28] & 4) != 0;
        }
        if (!bVar5) break;
        local_28 = local_28 + local_3c;
        local_5c = local_5c + 1;
      }
    }
  }
  if (local_28 < local_48) {
    if (*local_28 == 0x2e) {
      local_28 = local_28 + local_3c;
      local_70 = local_70 + 1;
      while( true ) {
        bVar5 = false;
        if (local_28 < local_48) {
          bVar5 = (""[*local_28] & 4) != 0;
        }
        if (!bVar5) break;
        if (local_58 < 0x1999999999999998) {
          local_58 = local_58 * 10 + (long)((char)*local_28 + -0x30);
          local_5c = local_5c + -1;
          local_6c = local_6c + 1;
        }
        local_28 = local_28 + local_3c;
      }
      in_stack_ffffffffffffff7f = 0;
    }
    if (local_28 < local_48) {
      if ((*local_28 == 0x65) || (*local_28 == 0x45)) {
        local_28 = local_28 + local_3c;
        iVar12 = 0;
        local_70 = local_70 + 1;
        if (local_48 <= local_28) goto LAB_00173ec2;
        if (*local_28 == 0x2d) {
          local_60 = -1;
          local_28 = local_28 + local_3c;
        }
        else if (*local_28 == 0x2b) {
          local_28 = local_28 + local_3c;
        }
        while( true ) {
          bVar5 = false;
          if (local_28 < local_48) {
            bVar5 = (""[*local_28] & 4) != 0;
          }
          if (!bVar5) break;
          if (iVar13 < 10000) {
            in_stack_ffffffffffffff78 = iVar13 * 10 + (char)*local_28 + -0x30;
          }
          else {
            in_stack_ffffffffffffff78 = 10000;
          }
          local_28 = local_28 + local_3c;
          iVar12 = 1;
          iVar13 = in_stack_ffffffffffffff78;
        }
        in_stack_ffffffffffffff7e = 0;
      }
      while( true ) {
        bVar5 = false;
        if (local_28 < local_48) {
          bVar5 = (""[*local_28] & 1) != 0;
        }
        if (!bVar5) break;
        local_28 = local_28 + local_3c;
      }
      in_stack_ffffffffffffff77 = 0;
    }
  }
LAB_00173ec2:
  if (local_58 == 0) {
    local_98 = -0.0;
    if (-1 < local_4c) {
      local_98 = 0.0;
    }
    *in_RSI = local_98;
  }
  else {
    for (uVar2 = iVar13 * local_60 + local_5c;
        uVar11 = 0 < (int)uVar2 && local_58 < 0x19999999999998cc,
        0 < (int)uVar2 && local_58 < 0x19999999999998cc; uVar2 = uVar2 - 1) {
      local_58 = local_58 * 10;
    }
    for (; bVar5 = local_58 % 10 == 0, uVar10 = (int)uVar2 < 0 && bVar5, (int)uVar2 < 0 && bVar5;
        uVar2 = uVar2 + 1) {
      local_58 = local_58 / 10;
    }
    auVar7._8_4_ = (int)(local_58 >> 0x20);
    auVar7._0_8_ = local_58;
    auVar7._12_4_ = 0x45300000;
    dVar6 = (auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_58) - 4503599627370496.0);
    if (1.844674407370955e+19 < dVar6) {
      local_10 = 0.0;
    }
    else {
      uVar3 = (long)dVar6 | (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f;
      if (local_58 < uVar3) {
        lVar4 = uVar3 - local_58;
        auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
        auVar9._0_8_ = lVar4;
        auVar9._12_4_ = 0x45300000;
        local_b0 = -((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
      }
      else {
        lVar4 = local_58 - uVar3;
        auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
        auVar8._0_8_ = lVar4;
        auVar8._12_4_ = 0x45300000;
        local_b0 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
      }
      local_10 = local_b0;
    }
    if ((int)uVar2 < 1) {
      while ((int)uVar2 < -99) {
        uVar2 = uVar2 + 100;
        dekkerMul2((double *)
                   CONCAT17(in_stack_ffffffffffffff7f,
                            CONCAT16(in_stack_ffffffffffffff7e,
                                     CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)))
                   ,(double)CONCAT44(uVar2,iVar12),
                   (double)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      }
      while ((int)uVar2 < -9) {
        uVar2 = uVar2 + 10;
        dekkerMul2((double *)
                   CONCAT17(in_stack_ffffffffffffff7f,
                            CONCAT16(in_stack_ffffffffffffff7e,
                                     CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)))
                   ,(double)CONCAT44(uVar2,iVar12),
                   (double)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      }
      while (0x7fffffff < uVar2) {
        uVar2 = uVar2 + 1;
        dekkerMul2((double *)
                   CONCAT17(in_stack_ffffffffffffff7f,
                            CONCAT16(in_stack_ffffffffffffff7e,
                                     CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)))
                   ,(double)CONCAT44(uVar2,iVar12),
                   (double)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      }
    }
    else {
      while (99 < (int)uVar2) {
        uVar2 = uVar2 - 100;
        dekkerMul2((double *)
                   CONCAT17(in_stack_ffffffffffffff7f,
                            CONCAT16(in_stack_ffffffffffffff7e,
                                     CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)))
                   ,(double)CONCAT44(uVar2,iVar12),
                   (double)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      }
      while (9 < (int)uVar2) {
        uVar2 = uVar2 - 10;
        dekkerMul2((double *)
                   CONCAT17(in_stack_ffffffffffffff7f,
                            CONCAT16(in_stack_ffffffffffffff7e,
                                     CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)))
                   ,(double)CONCAT44(uVar2,iVar12),
                   (double)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      }
      while (0 < (int)uVar2) {
        uVar2 = uVar2 - 1;
        dekkerMul2((double *)
                   CONCAT17(in_stack_ffffffffffffff7f,
                            CONCAT16(in_stack_ffffffffffffff7e,
                                     CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)))
                   ,(double)CONCAT44(uVar2,iVar12),
                   (double)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      }
    }
    *in_RSI = dVar6 + local_10;
    iVar13 = sqlite3IsNaN((double)CONCAT17(uVar11,CONCAT16(uVar10,in_stack_ffffffffffffff58)));
    if (iVar13 != 0) {
      *in_RSI = INFINITY;
    }
    if (local_4c < 0) {
      *in_RSI = -*in_RSI;
    }
  }
  if ((((local_28 == local_48) && (0 < local_6c)) && (iVar12 != 0)) && (0 < local_70)) {
    local_1c = local_70;
  }
  else if (((local_70 < 2) || ((local_70 != 3 && (iVar12 == 0)))) || (local_6c < 1)) {
    local_1c = 0;
  }
  else {
    local_1c = -1;
  }
LAB_00174308:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  u64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  int nDigit = 0;  /* Number of digits processed */
  int eType = 1;   /* 1: pure integer,  2+: fractional  -1 or less: bad UTF16 */
  u64 s2;          /* round-tripped significand */
  double rr[2];

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */
  if( length==0 ) return 0;

  if( enc==SQLITE_UTF8 ){
    incr = 1;
    zEnd = z + length;
  }else{
    int i;
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    testcase( enc==SQLITE_UTF16LE );
    testcase( enc==SQLITE_UTF16BE );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    if( i<length ) eType = -100;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigit++;
    if( s>=((LARGEST_UINT64-9)/10) ){
      /* skip non-significant significand digits
      ** (increase exponent by d to shift decimal left) */
      while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; d++; }
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    eType++;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_UINT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
        nDigit++;
      }
      z+=incr;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    eType++;

    /* This branch is needed to avoid a (harmless) buffer overread.  The
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* Zero is a special case */
  if( s==0 ){
    *pResult = sign<0 ? -0.0 : +0.0;
    goto atof_return;
  }

  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;

  /* Try to adjust the exponent to make it smaller */
  while( e>0 && s<((LARGEST_UINT64-0x7ff)/10) ){
    s *= 10;
    e--;
  }
  while( e<0 && (s%10)==0 ){
    s /= 10;
    e++;
  }

  rr[0] = (double)s;
  assert( sizeof(s2)==sizeof(rr[0]) );
#ifdef SQLITE_DEBUG
  rr[1] = 18446744073709549568.0;
  memcpy(&s2, &rr[1], sizeof(s2));
  assert( s2==0x43efffffffffffffLL );
#endif
  /* Largest double that can be safely converted to u64
  **         vvvvvvvvvvvvvvvvvvvvvv   */
  if( rr[0]<=18446744073709549568.0 ){
    s2 = (u64)rr[0];
    rr[1] = s>=s2 ? (double)(s - s2) : -(double)(s2 - s);
  }else{
    rr[1] = 0.0;
  }
  assert( rr[1]<=1.0e-10*rr[0] );  /* Equal only when rr[0]==0.0 */

  if( e>0 ){
    while( e>=100  ){
      e -= 100;
      dekkerMul2(rr, 1.0e+100, -1.5902891109759918046e+83);
    }
    while( e>=10   ){
      e -= 10;
      dekkerMul2(rr, 1.0e+10, 0.0);
    }
    while( e>=1    ){
      e -= 1;
      dekkerMul2(rr, 1.0e+01, 0.0);
    }
  }else{
    while( e<=-100 ){
      e += 100;
      dekkerMul2(rr, 1.0e-100, -1.99918998026028836196e-117);
    }
    while( e<=-10  ){
      e += 10;
      dekkerMul2(rr, 1.0e-10, -3.6432197315497741579e-27);
    }
    while( e<=-1   ){
      e += 1;
      dekkerMul2(rr, 1.0e-01, -5.5511151231257827021e-18);
    }
  }
  *pResult = rr[0]+rr[1];
  if( sqlite3IsNaN(*pResult) ) *pResult = 1e300*1e300;
  if( sign<0 ) *pResult = -*pResult;
  assert( !sqlite3IsNaN(*pResult) );

atof_return:
  /* return true if number and no extra non-whitespace characters after */
  if( z==zEnd && nDigit>0 && eValid && eType>0 ){
    return eType;
  }else if( eType>=2 && (eType==3 || eValid) && nDigit>0 ){
    return -1;
  }else{
    return 0;
  }
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}